

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationUtil.cpp
# Opt level: O3

Move<vk::Handle<(vk::HandleType)23>_> *
vkt::tessellation::makeFramebufferWithoutAttachments
          (Move<vk::Handle<(vk::HandleType)23>_> *__return_storage_ptr__,DeviceInterface *vk,
          VkDevice device,VkRenderPass renderPass)

{
  VkFramebufferCreateInfo framebufferInfo;
  VkFramebufferCreateInfo local_48;
  
  local_48.pNext = (void *)0x0;
  local_48.flags = 0;
  local_48._20_4_ = 0;
  local_48.width = 0;
  local_48.height = 0;
  local_48.layers = 0;
  local_48._60_4_ = 0;
  local_48.attachmentCount = 0;
  local_48._36_4_ = 0;
  local_48.pAttachments = (VkImageView *)0x0;
  local_48.sType = VK_STRUCTURE_TYPE_FRAMEBUFFER_CREATE_INFO;
  local_48._4_4_ = 0;
  local_48.renderPass.m_internal = renderPass.m_internal;
  ::vk::createFramebuffer(__return_storage_ptr__,vk,device,&local_48,(VkAllocationCallbacks *)0x0);
  return __return_storage_ptr__;
}

Assistant:

Move<VkFramebuffer> makeFramebufferWithoutAttachments (const DeviceInterface&		vk,
													   const VkDevice				device,
													   const VkRenderPass			renderPass)
{
	const VkFramebufferCreateInfo framebufferInfo = {
		VK_STRUCTURE_TYPE_FRAMEBUFFER_CREATE_INFO,		// VkStructureType                             sType;
		DE_NULL,										// const void*                                 pNext;
		(VkFramebufferCreateFlags)0,					// VkFramebufferCreateFlags                    flags;
		renderPass,										// VkRenderPass                                renderPass;
		0u,												// uint32_t                                    attachmentCount;
		DE_NULL,										// const VkImageView*                          pAttachments;
		0u,												// uint32_t                                    width;
		0u,												// uint32_t                                    height;
		0u,												// uint32_t                                    layers;
	};

	return createFramebuffer(vk, device, &framebufferInfo);
}